

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxRectsBinPack.cpp
# Opt level: O1

Rect * __thiscall
rbp::MaxRectsBinPack::Insert
          (Rect *__return_storage_ptr__,MaxRectsBinPack *this,int width,int height,
          FreeRectChoiceHeuristic method)

{
  pointer *ppRVar1;
  pointer pRVar2;
  pointer pRVar3;
  iterator __position;
  Rect freeNode;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  long lVar12;
  pointer __src;
  ulong uVar13;
  ulong uVar14;
  int score1;
  int score2;
  int local_50 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  uint32_t local_38;
  
  local_50[0] = 0x7fffffff;
  local_50[1] = 0x7fffffff;
  switch(method) {
  case RectBestShortSideFit:
    FindPositionForNewNodeBestShortSideFit
              (__return_storage_ptr__,this,width,height,local_50,local_50 + 1);
    break;
  case RectBestLongSideFit:
    FindPositionForNewNodeBestLongSideFit
              (__return_storage_ptr__,this,width,height,local_50 + 1,local_50);
    break;
  case RectBestAreaFit:
    FindPositionForNewNodeBestAreaFit
              (__return_storage_ptr__,this,width,height,local_50,local_50 + 1);
    break;
  case RectBottomLeftRule:
    FindPositionForNewNodeBottomLeft(__return_storage_ptr__,this,width,height,local_50,local_50 + 1)
    ;
    break;
  case RectContactPointRule:
    FindPositionForNewNodeContactPoint(__return_storage_ptr__,this,width,height,local_50);
  }
  if (__return_storage_ptr__->height != 0) {
    lVar12 = (long)(this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar12 != 0) {
      uVar14 = (lVar12 >> 2) * -0x3333333333333333;
      uVar13 = 0;
      do {
        pRVar2 = (this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_38 = pRVar2[uVar13].tag;
        pRVar2 = pRVar2 + uVar13;
        local_48._0_4_ = pRVar2->x;
        local_48._4_4_ = pRVar2->y;
        uStack_40._0_4_ = pRVar2->width;
        uStack_40._4_4_ = pRVar2->height;
        uVar4 = pRVar2->x;
        uVar5 = pRVar2->y;
        uVar6 = pRVar2->width;
        uVar7 = pRVar2->height;
        freeNode.height = uVar7;
        freeNode.width = uVar6;
        freeNode.y = uVar5;
        freeNode.x = uVar4;
        freeNode.tag = local_38;
        bVar11 = SplitFreeNode(this,freeNode,__return_storage_ptr__);
        if (bVar11) {
          pRVar2 = (this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pRVar3 = (this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          __src = pRVar2 + uVar13 + 1;
          if (__src != pRVar3) {
            memmove(pRVar2 + uVar13,__src,(long)pRVar3 - (long)__src);
          }
          ppRVar1 = &(this->freeRectangles).
                     super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppRVar1 = *ppRVar1 + -1;
          uVar13 = uVar13 - 1;
          uVar14 = uVar14 - 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar14);
    }
    PruneFreeList(this);
    __position._M_current =
         (this->usedRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->usedRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<rbp::Rect,std::allocator<rbp::Rect>>::_M_realloc_insert<rbp::Rect_const&>
                ((vector<rbp::Rect,std::allocator<rbp::Rect>> *)&this->usedRectangles,__position,
                 __return_storage_ptr__);
    }
    else {
      (__position._M_current)->tag = __return_storage_ptr__->tag;
      iVar8 = __return_storage_ptr__->y;
      iVar9 = __return_storage_ptr__->width;
      iVar10 = __return_storage_ptr__->height;
      (__position._M_current)->x = __return_storage_ptr__->x;
      (__position._M_current)->y = iVar8;
      (__position._M_current)->width = iVar9;
      (__position._M_current)->height = iVar10;
      ppRVar1 = &(this->usedRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Rect MaxRectsBinPack::Insert(int width, int height, FreeRectChoiceHeuristic method)
	{
		Rect newNode;
		// Unused in this function. We don't need to know the score after finding the position.
		int score1 = std::numeric_limits<int>::max();
		int score2 = std::numeric_limits<int>::max();
		switch (method)
		{
		case RectBestShortSideFit: newNode = FindPositionForNewNodeBestShortSideFit(width, height, score1, score2);
			break;
		case RectBottomLeftRule: newNode = FindPositionForNewNodeBottomLeft(width, height, score1, score2);
			break;
		case RectContactPointRule: newNode = FindPositionForNewNodeContactPoint(width, height, score1);
			break;
		case RectBestLongSideFit: newNode = FindPositionForNewNodeBestLongSideFit(width, height, score2, score1);
			break;
		case RectBestAreaFit: newNode = FindPositionForNewNodeBestAreaFit(width, height, score1, score2);
			break;
		}

		if (newNode.height == 0)
			return newNode;

		size_t numRectanglesToProcess = freeRectangles.size();
		for (size_t i = 0; i < numRectanglesToProcess; ++i)
		{
			if (SplitFreeNode(freeRectangles[i], newNode))
			{
				freeRectangles.erase(freeRectangles.begin() + i);
				--i;
				--numRectanglesToProcess;
			}
		}

		PruneFreeList();

		usedRectangles.push_back(newNode);
		return newNode;
	}